

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cymric.cpp
# Opt level: O3

int cymric_init_(int expected_version)

{
  int iVar1;
  
  iVar1 = -1;
  if (expected_version == 4) {
    iVar1 = 0;
    m_is_initialized = true;
  }
  return iVar1;
}

Assistant:

int cymric_init_(int expected_version) {
    if (CYMRIC_VERSION != expected_version)
        return -1;

#ifdef CYMRIC_WINMEM
    static_assert(sizeof(MEMORYSTATUS) <= SEED_SCRATCH_BYTES, "Fix this");
#endif

    m_is_initialized = true;
    return 0;
}